

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O2

int lws_get_urlarg_by_name_safe(lws *wsi,char *name,char *buf,int len)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int frag_idx;
  int iVar4;
  
  sVar3 = strlen(name);
  iVar4 = (int)sVar3;
  frag_idx = 0;
  while( true ) {
    iVar1 = lws_hdr_copy_fragment(wsi,buf,len,WSI_TOKEN_HTTP_URI_ARGS,frag_idx);
    if (iVar1 < 0) {
      return -1;
    }
    if ((iVar4 <= iVar1 && iVar1 + 1 < len) && (iVar2 = strncmp(buf,name,(long)iVar4), iVar2 == 0))
    break;
    frag_idx = frag_idx + 1;
  }
  if (iVar4 < iVar1 && name[(long)((sVar3 << 0x20) + -0x100000000) >> 0x20] != '=') {
    iVar4 = iVar4 + (uint)(buf[iVar4] == '=');
  }
  iVar1 = iVar1 - iVar4;
  memmove(buf,buf + iVar4,(long)iVar1);
  buf[iVar1] = '\0';
  return iVar1;
}

Assistant:

int
lws_get_urlarg_by_name_safe(struct lws *wsi, const char *name, char *buf, int len)
{
	int n = 0, fraglen, sl = (int)strlen(name);

	do {
		fraglen = lws_hdr_copy_fragment(wsi, buf, len,
						WSI_TOKEN_HTTP_URI_ARGS, n);

		if (fraglen < 0)
			break;

		if (fraglen + 1 < len &&
		    fraglen >= sl &&
		    !strncmp(buf, name, (size_t)sl)) {
			/*
			 * If he left off the trailing =, trim it from the
			 * result
			 */

			if (name[sl - 1] != '=' &&
			    sl < fraglen &&
			    buf[sl] == '=')
				sl++;

			memmove(buf, buf + sl, (size_t)(fraglen - sl));
			buf[fraglen - sl] = '\0';

			return fraglen - sl;
		}

		n++;
	} while (1);

	return -1;
}